

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::addEquation(Parser *this,Token *startToken,Identifier *name,string *value)

{
  pointer pFVar1;
  TokenizerPosition start;
  __type _Var2;
  TokenType TVar3;
  Token *pTVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_t referenceIndex;
  FileEntry *entry;
  pointer pFVar5;
  vector<Token,_std::allocator<Token>_> tokens;
  FileTokenizer tok;
  TextFile f;
  vector<Token,_std::allocator<Token>_> vStack_448;
  FileTokenizer local_430;
  TextFile local_2f8;
  
  TextFile::TextFile(&local_2f8);
  TextFile::openMemory(&local_2f8,value);
  FileTokenizer::FileTokenizer(&local_430);
  FileTokenizer::init(&local_430,(EVP_PKEY_CTX *)&local_2f8);
  start.it._M_node = local_430.super_Tokenizer.position.it._M_node;
  do {
    if ((local_430.super_Tokenizer.position.it._M_node == (iterator)&local_430) ||
       (pTVar4 = Tokenizer::peekToken(&local_430.super_Tokenizer,0), pTVar4->type == Separator)) {
      Tokenizer::getTokens
                (&vStack_448,&local_430.super_Tokenizer,start,local_430.super_Tokenizer.position);
      referenceIndex = Tokenizer::addEquValue(&vStack_448);
      pFVar1 = (this->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pFVar5 = (this->entries).
                    super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar1; pFVar5 = pFVar5 + 1)
      {
        Tokenizer::resetLookaheadCheckMarks(pFVar5->tokenizer);
      }
      SymbolTable::addEquation
                (&Global.symbolTable,name,Global.FileInfo.FileNum,Global.Section,referenceIndex);
      std::vector<Token,_std::allocator<Token>_>::~vector(&vStack_448);
      goto LAB_0014044e;
    }
    pTVar4 = Tokenizer::nextToken(&local_430.super_Tokenizer);
    TVar3 = pTVar4->type;
    if (TVar3 == Identifier) {
      __lhs = &Token::identifierValue(pTVar4)->_name;
      _Var2 = std::operator==(__lhs,&name->_name);
      if (_Var2) {
        printError<Identifier>
                  (this,startToken,"Recursive equ definition for \"%s\" not allowed",name);
        goto LAB_0014044e;
      }
      TVar3 = pTVar4->type;
    }
  } while (TVar3 != Equ);
  printError<>(this,startToken,"equ value must not contain another equ instance");
LAB_0014044e:
  FileTokenizer::~FileTokenizer(&local_430);
  TextFile::~TextFile(&local_2f8);
  return;
}

Assistant:

void Parser::addEquation(const Token& startToken, const Identifier& name, const std::string& value)
{
	// parse value string
	TextFile f;
	f.openMemory(value);

	FileTokenizer tok;
	tok.init(&f);

	TokenizerPosition start = tok.getPosition();
	while (!tok.atEnd() && tok.peekToken().type != TokenType::Separator)
	{
		const Token& token = tok.nextToken();
		if (token.type == TokenType::Identifier && token.identifierValue() == name)
		{
			printError(startToken, "Recursive equ definition for \"%s\" not allowed",name);
			return;
		}

		if (token.type == TokenType::Equ)
		{
			printError(startToken, "equ value must not contain another equ instance");
			return;
		}
	}

	// extract tokens
	TokenizerPosition end = tok.getPosition();
	std::vector<Token> tokens = tok.getTokens(start, end);
	size_t index = Tokenizer::addEquValue(tokens);

	for (FileEntry& entry : entries)
		entry.tokenizer->resetLookaheadCheckMarks();

	// register equation
	Global.symbolTable.addEquation(name, Global.FileInfo.FileNum, Global.Section, index);
}